

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

void jinit_arith_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*__s) [64];
  int iVar2;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x158);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass;
  memset(&pjVar1[3].decode_mcu,0,0x100);
  *(undefined1 *)&pjVar1[0xe].start_pass = 0x71;
  if (cinfo->progressive_mode != 0) {
    __s = (int (*) [64])
          (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 9);
    cinfo->coef_bits = __s;
    if (0 < cinfo->num_components) {
      iVar2 = 0;
      do {
        memset(__s,0xff,0x100);
        __s = __s + 1;
        iVar2 = iVar2 + 1;
      } while (iVar2 < cinfo->num_components);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_arith_decoder(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy;
  int i;

  entropy = (arith_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(arith_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    entropy->dc_stats[i] = NULL;
    entropy->ac_stats[i] = NULL;
  }

  /* Initialize index for fixed probability estimation */
  entropy->fixed_bin[0] = 113;

  if (cinfo->progressive_mode) {
    /* Create progression status table */
    int *coef_bit_ptr, ci;
    cinfo->coef_bits = (int (*)[DCTSIZE2])
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  cinfo->num_components * 2 * DCTSIZE2 *
                                  sizeof(int));
    coef_bit_ptr = &cinfo->coef_bits[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (i = 0; i < DCTSIZE2; i++)
        *coef_bit_ptr++ = -1;
  }
}